

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

qreal __thiscall
QScrollerPrivate::nextSnapPos(QScrollerPrivate *this,qreal p,int dir,Orientation orientation)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_48;
  
  dVar13 = (double)qQNaN();
  local_48 = (double)qInf();
  if (orientation != Horizontal) {
    dVar14 = (this->contentPosRange).yp;
    dVar4 = (this->contentPosRange).h + dVar14;
    pdVar2 = (this->snapPositionsY).d.ptr;
    lVar3 = (this->snapPositionsY).d.size;
    for (lVar7 = 0; lVar3 << 3 != lVar7; lVar7 = lVar7 + 8) {
      dVar1 = *(double *)((long)pdVar2 + lVar7);
      dVar12 = dVar1 - p;
      if ((((dir < 1 || 0.0 <= dVar12) && (-1 < dir || dVar12 <= 0.0)) && (dVar14 <= dVar1)) &&
         (dVar1 <= dVar4)) {
        cVar6 = qIsNaN(dVar13);
        if (cVar6 == '\0') {
          dVar5 = -dVar12;
          uVar10 = (uint)((ulong)dVar5 >> 0x20);
          if (local_48 <=
              (double)(~-(ulong)(dVar12 < dVar5) & (ulong)dVar12 |
                      -(ulong)(dVar12 < dVar5) & (ulong)dVar5)) goto LAB_005da4e8;
        }
        else {
          uVar10 = (uint)((ulong)dVar12 >> 0x20) ^ 0x80000000;
        }
        local_48 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar12 |
                           CONCAT44(uVar10,SUB84(dVar12,0)) & -(ulong)(dVar12 < 0.0));
        dVar13 = dVar1;
      }
LAB_005da4e8:
    }
    dVar1 = this->snapIntervalY;
    if (dVar1 <= 0.0) {
      return dVar13;
    }
    dVar14 = dVar14 + this->snapFirstY;
    if (dir < 1) {
      if (dir < 0) {
        dVar12 = floor((p - dVar14) / dVar1);
        uVar9 = SUB84(dVar12,0);
        uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
        goto LAB_005da5e1;
      }
      dVar12 = dVar14;
      if (p <= dVar14) goto LAB_005da5ff;
      dVar12 = floor((dVar4 - dVar14) / dVar1);
      dVar12 = (double)(int)dVar12 * dVar1 + dVar14;
      if (dVar12 <= p) goto LAB_005da5ff;
      dVar12 = (p - dVar14) / dVar1;
      dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
    }
    else {
      dVar12 = ceil((p - dVar14) / dVar1);
      uVar9 = SUB84(dVar12,0);
      uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
LAB_005da5e1:
      dVar12 = (double)CONCAT44(uVar11,uVar9);
    }
    dVar12 = (double)(int)dVar12 * dVar1 + dVar14;
LAB_005da5ff:
    if (dVar12 < dVar14) {
      return dVar13;
    }
    if (dVar4 < dVar12) {
      return dVar13;
    }
    cVar6 = qIsNaN(dVar13);
    if (cVar6 != '\0') {
      return dVar12;
    }
    dVar14 = dVar12 - p;
    uVar8 = -(ulong)(dVar14 < -dVar14);
    if ((double)(~uVar8 & (ulong)dVar14 | (ulong)-dVar14 & uVar8) < local_48) {
      return dVar12;
    }
    return dVar13;
  }
  dVar14 = (this->contentPosRange).xp;
  dVar4 = (this->contentPosRange).w + dVar14;
  pdVar2 = (this->snapPositionsX).d.ptr;
  lVar3 = (this->snapPositionsX).d.size;
  for (lVar7 = 0; lVar3 << 3 != lVar7; lVar7 = lVar7 + 8) {
    dVar1 = *(double *)((long)pdVar2 + lVar7);
    dVar12 = dVar1 - p;
    if (((dir < 1 || 0.0 <= dVar12) && (-1 < dir || dVar12 <= 0.0)) &&
       ((dVar14 <= dVar1 && (dVar1 <= dVar4)))) {
      cVar6 = qIsNaN(dVar13);
      if (cVar6 == '\0') {
        dVar5 = -dVar12;
        uVar10 = (uint)((ulong)dVar5 >> 0x20);
        if (local_48 <=
            (double)(~-(ulong)(dVar12 < dVar5) & (ulong)dVar12 |
                    -(ulong)(dVar12 < dVar5) & (ulong)dVar5)) goto LAB_005da398;
      }
      else {
        uVar10 = (uint)((ulong)dVar12 >> 0x20) ^ 0x80000000;
      }
      local_48 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar12 |
                         CONCAT44(uVar10,SUB84(dVar12,0)) & -(ulong)(dVar12 < 0.0));
      dVar13 = dVar1;
    }
LAB_005da398:
  }
  dVar1 = this->snapIntervalX;
  if (dVar1 <= 0.0) {
    return dVar13;
  }
  dVar14 = dVar14 + this->snapFirstX;
  if (dir < 1) {
    if (dir < 0) {
      dVar12 = floor((p - dVar14) / dVar1);
      uVar9 = SUB84(dVar12,0);
      uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
      goto LAB_005da53c;
    }
    dVar12 = dVar14;
    if (p <= dVar14) goto LAB_005da55a;
    dVar12 = floor((dVar4 - dVar14) / dVar1);
    dVar12 = (double)(int)dVar12 * dVar1 + dVar14;
    if (dVar12 <= p) goto LAB_005da55a;
    dVar12 = (p - dVar14) / dVar1;
    dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
  }
  else {
    dVar12 = ceil((p - dVar14) / dVar1);
    uVar9 = SUB84(dVar12,0);
    uVar11 = (undefined4)((ulong)dVar12 >> 0x20);
LAB_005da53c:
    dVar12 = (double)CONCAT44(uVar11,uVar9);
  }
  dVar12 = (double)(int)dVar12 * dVar1 + dVar14;
LAB_005da55a:
  if (dVar12 < dVar14) {
    return dVar13;
  }
  if (dVar4 < dVar12) {
    return dVar13;
  }
  cVar6 = qIsNaN(dVar13);
  if (cVar6 != '\0') {
    return dVar12;
  }
  dVar14 = dVar12 - p;
  uVar8 = -(ulong)(dVar14 < -dVar14);
  if ((double)(~uVar8 & (ulong)dVar14 | (ulong)-dVar14 & uVar8) < local_48) {
    return dVar12;
  }
  return dVar13;
}

Assistant:

qreal QScrollerPrivate::nextSnapPos(qreal p, int dir, Qt::Orientation orientation) const
{
    qreal bestSnapPos = Q_QNAN;
    qreal bestSnapPosDist = Q_INFINITY;

    qreal minPos;
    qreal maxPos;

    if (orientation == Qt::Horizontal) {
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
    } else {
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
    }

    if (orientation == Qt::Horizontal) {
        // the snap points in the list
        for (qreal snapPos : snapPositionsX) {
            qreal snapPosDist = snapPos - p;
            if ((dir > 0 && snapPosDist < 0) ||
                (dir < 0 && snapPosDist > 0))
                continue; // wrong direction
            if (snapPos < minPos || snapPos > maxPos )
                continue; // invalid

            if (qIsNaN(bestSnapPos) ||
                qAbs(snapPosDist) < bestSnapPosDist ) {
                bestSnapPos = snapPos;
                bestSnapPosDist = qAbs(snapPosDist);
            }
        }

        // the snap point interval
        if (snapIntervalX > 0.0) {
            qreal first = minPos + snapFirstX;
            qreal snapPos;
            if (dir > 0)
                snapPos = qCeil((p - first) / snapIntervalX) * snapIntervalX + first;
            else if (dir < 0)
                snapPos = qFloor((p - first) / snapIntervalX) * snapIntervalX + first;
            else if (p <= first)
                snapPos = first;
            else
            {
                qreal last = qFloor((maxPos - first) / snapIntervalX) * snapIntervalX + first;
                if (p >= last)
                    snapPos = last;
                else
                    snapPos = qRound((p - first) / snapIntervalX) * snapIntervalX + first;
            }

            if (snapPos >= first && snapPos <= maxPos ) {
                qreal snapPosDist = snapPos - p;

                if (qIsNaN(bestSnapPos) ||
                    qAbs(snapPosDist) < bestSnapPosDist ) {
                    bestSnapPos = snapPos;
                    bestSnapPosDist = qAbs(snapPosDist);
                }
            }
        }

    } else { // (orientation == Qt::Vertical)
        // the snap points in the list
        for (qreal snapPos : snapPositionsY) {
            qreal snapPosDist = snapPos - p;
            if ((dir > 0 && snapPosDist < 0) ||
                (dir < 0 && snapPosDist > 0))
                continue; // wrong direction
            if (snapPos < minPos || snapPos > maxPos )
                continue; // invalid

            if (qIsNaN(bestSnapPos) ||
                qAbs(snapPosDist) < bestSnapPosDist) {
                bestSnapPos = snapPos;
                bestSnapPosDist = qAbs(snapPosDist);
            }
        }

        // the snap point interval
        if (snapIntervalY > 0.0) {
            qreal first = minPos + snapFirstY;
            qreal snapPos;
            if (dir > 0)
                snapPos = qCeil((p - first) / snapIntervalY) * snapIntervalY + first;
            else if (dir < 0)
                snapPos = qFloor((p - first) / snapIntervalY) * snapIntervalY + first;
            else if (p <= first)
                snapPos = first;
            else
            {
                qreal last = qFloor((maxPos - first) / snapIntervalY) * snapIntervalY + first;
                if (p >= last)
                    snapPos = last;
                else
                    snapPos = qRound((p - first) / snapIntervalY) * snapIntervalY + first;
            }

            if (snapPos >= first && snapPos <= maxPos ) {
                qreal snapPosDist = snapPos - p;

                if (qIsNaN(bestSnapPos) ||
                    qAbs(snapPosDist) < bestSnapPosDist) {
                    bestSnapPos = snapPos;
                    bestSnapPosDist = qAbs(snapPosDist);
                }
            }
        }
    }

    return bestSnapPos;
}